

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode Curl_getformdata(SessionHandle *data,FormData **finalform,curl_httppost *post,
                         char *custom_content_type,curl_off_t *sizep)

{
  int iVar1;
  char *pcVar2;
  FILE *local_298;
  curl_off_t *local_290;
  undefined1 local_288 [8];
  char buffer [512];
  size_t nread;
  FILE *fileread;
  curl_slist *curList;
  char *fileboundary;
  char *boundary;
  curl_off_t size;
  curl_httppost *pcStack_50;
  CURLcode result;
  curl_httppost *file;
  FormData *firstform;
  FormData *form;
  curl_off_t *sizep_local;
  char *custom_content_type_local;
  curl_httppost *post_local;
  FormData **finalform_local;
  SessionHandle *data_local;
  
  firstform = (FormData *)0x0;
  size._4_4_ = 0;
  boundary = (char *)0x0;
  curList = (curl_slist *)0x0;
  *finalform = (FormData *)0x0;
  if (post == (curl_httppost *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    form = (FormData *)sizep;
    sizep_local = (curl_off_t *)custom_content_type;
    custom_content_type_local = (char *)post;
    post_local = (curl_httppost *)finalform;
    finalform_local = (FormData **)data;
    pcVar2 = formboundary(data);
    if (pcVar2 == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      if (sizep_local == (curl_off_t *)0x0) {
        local_290 = (curl_off_t *)0x90a73e;
      }
      else {
        local_290 = sizep_local;
      }
      size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)0x0,"%s; boundary=%s\r\n",local_290,pcVar2)
      ;
      if (size._4_4_ == CURLE_OK) {
        file = (curl_httppost *)firstform;
        size._4_4_ = CURLE_OK;
LAB_008905df:
        if (boundary != (char *)0x0) {
          size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"\r\n");
          if (size._4_4_ != CURLE_OK) goto LAB_00890af1;
          size._4_4_ = CURLE_OK;
        }
        size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"--%s\r\n",pcVar2);
        if ((((size._4_4_ != CURLE_OK) ||
             (size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,
                                        "Content-Disposition: form-data; name=\""),
             size._4_4_ != CURLE_OK)) ||
            (size._4_4_ = AddFormData(&firstform,FORM_DATA,*(void **)(custom_content_type_local + 8)
                                      ,*(size_t *)(custom_content_type_local + 0x10),
                                      (curl_off_t *)&boundary), size._4_4_ != CURLE_OK)) ||
           (size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"\""),
           size._4_4_ != CURLE_OK)) goto LAB_00890af1;
        if (*(long *)(custom_content_type_local + 0x48) != 0) {
          if (curList != (curl_slist *)0x0) {
            (*Curl_cfree)(curList);
          }
          curList = (curl_slist *)formboundary((SessionHandle *)finalform_local);
          if (curList == (curl_slist *)0x0) {
            size._4_4_ = CURLE_OUT_OF_MEMORY;
LAB_00890af1:
            if (size._4_4_ == CURLE_OK) {
              size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"\r\n--%s--\r\n",pcVar2);
            }
            if (size._4_4_ != CURLE_OK) {
              Curl_formclean((FormData **)&file);
              if (curList != (curl_slist *)0x0) {
                (*Curl_cfree)(curList);
              }
              if (pcVar2 != (char *)0x0) {
                (*Curl_cfree)(pcVar2);
              }
              return size._4_4_;
            }
            form->next = (FormData *)boundary;
            if (curList != (curl_slist *)0x0) {
              (*Curl_cfree)(curList);
            }
            if (pcVar2 != (char *)0x0) {
              (*Curl_cfree)(pcVar2);
            }
            post_local->next = file;
            return size._4_4_;
          }
          size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,
                                    "\r\nContent-Type: multipart/mixed; boundary=%s\r\n",curList);
          if (size._4_4_ != CURLE_OK) goto LAB_00890af1;
        }
        pcStack_50 = (curl_httppost *)custom_content_type_local;
        do {
          if (*(long *)(custom_content_type_local + 0x48) == 0) {
            if ((*(ulong *)(custom_content_type_local + 0x50) & 0x51) != 0) {
              if ((*(long *)(custom_content_type_local + 0x58) != 0) ||
                 ((*(ulong *)(custom_content_type_local + 0x50) & 1) != 0)) {
                size._4_4_ = formdata_add_filename
                                       ((curl_httppost *)custom_content_type_local,&firstform,
                                        (curl_off_t *)&boundary);
              }
              goto joined_r0x008907c4;
            }
          }
          else {
            size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,
                                      "\r\n--%s\r\nContent-Disposition: attachment",curList);
            if (size._4_4_ != CURLE_OK) goto LAB_00890aa0;
            size._4_4_ = formdata_add_filename(pcStack_50,&firstform,(curl_off_t *)&boundary);
joined_r0x008907c4:
            if (size._4_4_ != CURLE_OK) goto LAB_00890aa0;
          }
          if ((pcStack_50->contenttype != (char *)0x0) &&
             (size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"\r\nContent-Type: %s",
                                        pcStack_50->contenttype), size._4_4_ != CURLE_OK))
          goto LAB_00890aa0;
          fileread = (FILE *)pcStack_50->contentheader;
          while ((fileread != (FILE *)0x0 &&
                 (size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"\r\n%s",
                                            *(undefined8 *)fileread), size._4_4_ == CURLE_OK))) {
            fileread = (FILE *)fileread->_IO_read_ptr;
          }
          if ((size._4_4_ != CURLE_OK) ||
             (size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"\r\n\r\n"),
             size._4_4_ != CURLE_OK)) goto LAB_00890aa0;
          if (((*(ulong *)(custom_content_type_local + 0x50) & 1) == 0) &&
             ((*(ulong *)(custom_content_type_local + 0x50) & 2) == 0)) {
            if ((*(ulong *)(custom_content_type_local + 0x50) & 0x10) == 0) {
              if ((*(ulong *)(custom_content_type_local + 0x50) & 0x40) == 0) {
                size._4_4_ = AddFormData(&firstform,FORM_CONTENT,
                                         *(void **)(custom_content_type_local + 0x18),
                                         *(size_t *)(custom_content_type_local + 0x20),
                                         (curl_off_t *)&boundary);
              }
              else {
                size._4_4_ = AddFormData(&firstform,FORM_CALLBACK,
                                         *(void **)(custom_content_type_local + 0x60),
                                         *(size_t *)(custom_content_type_local + 0x20),
                                         (curl_off_t *)&boundary);
              }
            }
            else {
              size._4_4_ = AddFormData(&firstform,FORM_CONTENT,
                                       *(void **)(custom_content_type_local + 0x28),
                                       *(size_t *)(custom_content_type_local + 0x30),
                                       (curl_off_t *)&boundary);
            }
          }
          else {
            iVar1 = curl_strequal("-",pcStack_50->contents);
            if (iVar1 == 0) {
              local_298 = fopen64(pcStack_50->contents,"rb");
            }
            else {
              local_298 = _stdin;
            }
            if (local_298 == (FILE *)0x0) {
              if (finalform_local != (FormData **)0x0) {
                Curl_failf((SessionHandle *)finalform_local,"couldn\'t open file \"%s\"",
                           pcStack_50->contents);
              }
              post_local->next = (curl_httppost *)0x0;
              size._4_4_ = CURLE_READ_ERROR;
            }
            else if (local_298 == _stdin) {
              do {
                buffer._504_8_ = fread(local_288,1,0x200,local_298);
                if (buffer._504_8_ == 0) break;
                size._4_4_ = AddFormData(&firstform,FORM_CONTENT,local_288,buffer._504_8_,
                                         (curl_off_t *)&boundary);
              } while (size._4_4_ == CURLE_OK);
            }
            else {
              fclose(local_298);
              size._4_4_ = AddFormData(&firstform,FORM_FILE,pcStack_50->contents,0,
                                       (curl_off_t *)&boundary);
            }
          }
          pcStack_50 = pcStack_50->more;
          if (pcStack_50 == (curl_httppost *)0x0 || size._4_4_ != CURLE_OK) goto LAB_00890aa0;
        } while( true );
      }
      if (pcVar2 != (char *)0x0) {
        (*Curl_cfree)(pcVar2);
      }
      data_local._4_4_ = size._4_4_;
    }
  }
  return data_local._4_4_;
LAB_00890aa0:
  if ((size._4_4_ != CURLE_OK) ||
     (((*(long *)(custom_content_type_local + 0x48) != 0 &&
       (size._4_4_ = AddFormDataf(&firstform,(curl_off_t *)&boundary,"\r\n--%s--",curList),
       size._4_4_ != CURLE_OK)) ||
      (custom_content_type_local = *(char **)custom_content_type_local,
      custom_content_type_local == (char *)0x0)))) goto LAB_00890af1;
  goto LAB_008905df;
}

Assistant:

CURLcode Curl_getformdata(struct SessionHandle *data,
                          struct FormData **finalform,
                          struct curl_httppost *post,
                          const char *custom_content_type,
                          curl_off_t *sizep)
{
  struct FormData *form = NULL;
  struct FormData *firstform;
  struct curl_httppost *file;
  CURLcode result = CURLE_OK;

  curl_off_t size = 0; /* support potentially ENORMOUS formposts */
  char *boundary;
  char *fileboundary = NULL;
  struct curl_slist* curList;

  *finalform = NULL; /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  boundary = formboundary(data);
  if(!boundary)
    return CURLE_OUT_OF_MEMORY;

  /* Make the first line of the output */
  result = AddFormDataf(&form, NULL,
                        "%s; boundary=%s\r\n",
                        custom_content_type?custom_content_type:
                        "Content-Type: multipart/form-data",
                        boundary);

  if(result) {
    Curl_safefree(boundary);
    return result;
  }
  /* we DO NOT include that line in the total size of the POST, since it'll be
     part of the header! */

  firstform = form;

  do {

    if(size) {
      result = AddFormDataf(&form, &size, "\r\n");
      if(result)
        break;
    }

    /* boundary */
    result = AddFormDataf(&form, &size, "--%s\r\n", boundary);
    if(result)
      break;

    /* Maybe later this should be disabled when a custom_content_type is
       passed, since Content-Disposition is not meaningful for all multipart
       types.
    */
    result = AddFormDataf(&form, &size,
                          "Content-Disposition: form-data; name=\"");
    if(result)
      break;

    result = AddFormData(&form, FORM_DATA, post->name, post->namelength,
                         &size);
    if(result)
      break;

    result = AddFormDataf(&form, &size, "\"");
    if(result)
      break;

    if(post->more) {
      /* If used, this is a link to more file names, we must then do
         the magic to include several files with the same field name */

      Curl_safefree(fileboundary);
      fileboundary = formboundary(data);
      if(!fileboundary) {
        result = CURLE_OUT_OF_MEMORY;
        break;
      }

      result = AddFormDataf(&form, &size,
                            "\r\nContent-Type: multipart/mixed;"
                            " boundary=%s\r\n",
                            fileboundary);
      if(result)
        break;
    }

    file = post;

    do {

      /* If 'showfilename' is set, that is a faked name passed on to us
         to use to in the formpost. If that is not set, the actually used
         local file name should be added. */

      if(post->more) {
        /* if multiple-file */
        result = AddFormDataf(&form, &size,
                              "\r\n--%s\r\nContent-Disposition: "
                              "attachment",
                              fileboundary);
        if(result)
          break;
        result = formdata_add_filename(file, &form, &size);
        if(result)
          break;
      }
      else if(post->flags & (HTTPPOST_FILENAME|HTTPPOST_BUFFER|
                             HTTPPOST_CALLBACK)) {
        /* it should be noted that for the HTTPPOST_FILENAME and
           HTTPPOST_CALLBACK cases the ->showfilename struct member is always
           assigned at this point */
        if(post->showfilename || (post->flags & HTTPPOST_FILENAME)) {
          result = formdata_add_filename(post, &form, &size);
        }

        if(result)
          break;
      }

      if(file->contenttype) {
        /* we have a specified type */
        result = AddFormDataf(&form, &size,
                              "\r\nContent-Type: %s",
                              file->contenttype);
        if(result)
          break;
      }

      curList = file->contentheader;
      while(curList) {
        /* Process the additional headers specified for this form */
        result = AddFormDataf( &form, &size, "\r\n%s", curList->data );
        if(result)
          break;
        curList = curList->next;
      }
      if(result)
        break;

      result = AddFormDataf(&form, &size, "\r\n\r\n");
      if(result)
        break;

      if((post->flags & HTTPPOST_FILENAME) ||
         (post->flags & HTTPPOST_READFILE)) {
        /* we should include the contents from the specified file */
        FILE *fileread;

        fileread = strequal("-", file->contents)?
          stdin:fopen(file->contents, "rb"); /* binary read for win32  */

        /*
         * VMS: This only allows for stream files on VMS.  Stream files are
         * OK, as are FIXED & VAR files WITHOUT implied CC For implied CC,
         * every record needs to have a \n appended & 1 added to SIZE
         */

        if(fileread) {
          if(fileread != stdin) {
            /* close the file */
            fclose(fileread);
            /* add the file name only - for later reading from this */
            result = AddFormData(&form, FORM_FILE, file->contents, 0, &size);
          }
          else {
            /* When uploading from stdin, we can't know the size of the file,
             * thus must read the full file as before. We *could* use chunked
             * transfer-encoding, but that only works for HTTP 1.1 and we
             * can't be sure we work with such a server.
             */
            size_t nread;
            char buffer[512];
            while((nread = fread(buffer, 1, sizeof(buffer), fileread)) != 0) {
              result = AddFormData(&form, FORM_CONTENT, buffer, nread, &size);
              if(result)
                break;
            }
          }
        }
        else {
          if(data)
            failf(data, "couldn't open file \"%s\"", file->contents);
          *finalform = NULL;
          result = CURLE_READ_ERROR;
        }
      }
      else if(post->flags & HTTPPOST_BUFFER)
        /* include contents of buffer */
        result = AddFormData(&form, FORM_CONTENT, post->buffer,
                             post->bufferlength, &size);
      else if(post->flags & HTTPPOST_CALLBACK)
        /* the contents should be read with the callback and the size
           is set with the contentslength */
        result = AddFormData(&form, FORM_CALLBACK, post->userp,
                             post->contentslength, &size);
      else
        /* include the contents we got */
        result = AddFormData(&form, FORM_CONTENT, post->contents,
                             post->contentslength, &size);

      file = file->more;
    } while(file && !result); /* for each specified file for this field */

    if(result)
      break;

    if(post->more) {
      /* this was a multiple-file inclusion, make a termination file
         boundary: */
      result = AddFormDataf(&form, &size,
                           "\r\n--%s--",
                           fileboundary);
      if(result)
        break;
    }

  } while((post = post->next) != NULL); /* for each field */

  /* end-boundary for everything */
  if(CURLE_OK == result)
    result = AddFormDataf(&form, &size,
                          "\r\n--%s--\r\n",
                          boundary);

  if(result) {
    Curl_formclean(&firstform);
    Curl_safefree(fileboundary);
    Curl_safefree(boundary);
    return result;
  }

  *sizep = size;

  Curl_safefree(fileboundary);
  Curl_safefree(boundary);

  *finalform = firstform;

  return result;
}